

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fog.cpp
# Opt level: O1

int AF_A_FogSpawn(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *pAVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  PClassActor *type;
  AActor *pAVar9;
  VMValue *pVVar10;
  char *__assertion;
  bool bVar11;
  FName local_44;
  DVector3 local_40;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b714a;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    pAVar2 = (AActor *)(param->field_0).field_1.a;
    pVVar10 = param;
    uVar6 = numparam;
    if (pAVar2 != (AActor *)0x0) {
      if ((pAVar2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
        (pAVar2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar8 = (pAVar2->super_DThinker).super_DObject.Class;
      bVar11 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar6 = (uint)bVar11;
      pVVar10 = (VMValue *)(ulong)(pPVar8 == pPVar4 || bVar11);
      if (pPVar8 != pPVar4 && !bVar11) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar4) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b714a;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b711f;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar7 = (**(code **)*puVar3)(puVar3,pVVar10,uVar6,ret);
          puVar3[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar3[1];
        bVar11 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar4 && bVar11) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar11 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar4) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b714a;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      iVar5 = pAVar2->special1;
      pAVar2->special1 = iVar5 + -1;
      if (iVar5 < 1) {
        pAVar2->special1 = pAVar2->args[2];
        uVar6 = FRandom::GenRand32(&pr_fogspawn);
        local_44.Index =
             FName::NameManager::FindName
                       (&FName::NameData,
                        _ZZL13AF_A_FogSpawnP12VMFrameStackP7VMValueiP8VMReturniE4fogs_rel +
                        *(int *)(_ZZL13AF_A_FogSpawnP12VMFrameStackP7VMValueiP8VMReturniE4fogs_rel +
                                (ulong)((uVar6 & 0xff) % 3) * 4),false);
        local_40.X = (pAVar2->__Pos).X;
        local_40.Y = (pAVar2->__Pos).Y;
        local_40.Z = (pAVar2->__Pos).Z;
        type = ClassForSpawn(&local_44);
        pAVar9 = AActor::StaticSpawn(type,&local_40,ALLOW_REPLACE,false);
        if (pAVar9 != (AActor *)0x0) {
          iVar5 = pAVar2->args[1] + (uint)(pAVar2->args[1] == 0);
          uVar6 = FRandom::GenRand32(&pr_fogspawn);
          (pAVar9->Angles).Yaw.Degrees =
               (double)((int)((long)(ulong)(uVar6 & 0xff) % (long)iVar5) - (iVar5 >> 1)) * 1.40625 +
               (pAVar2->Angles).Yaw.Degrees;
          (pAVar9->target).field_0.p = pAVar2;
          if (pAVar2->args[0] < 1) {
            pAVar2->args[0] = 1;
          }
          uVar6 = FRandom::GenRand32(&pr_fogspawn);
          pAVar9->args[0] = (int)((long)(ulong)(uVar6 & 0xff) % (long)pAVar2->args[0]) + 1;
          pAVar9->args[3] = pAVar2->args[3];
          pAVar9->args[4] = 1;
          uVar6 = FRandom::GenRand32(&pr_fogspawn);
          pAVar9->WeaveIndexZ = (byte)uVar6 & 0x3f;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b711f:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b714a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FogSpawn)
{
	PARAM_ACTION_PROLOGUE;

	static const char *fogs[3] =
	{
		"FogPatchSmall",
		"FogPatchMedium",
		"FogPatchLarge"
	};

	AActor *mo = NULL;
	int delta;

	if (self->special1-- > 0)
	{
		return 0;
	}
	self->special1 = self->args[2];		// Reset frequency count

	mo = Spawn (fogs[pr_fogspawn()%3], self->Pos(), ALLOW_REPLACE);

	if (mo)
	{
		delta = self->args[1];
		if (delta==0) delta=1;
		mo->Angles.Yaw = self->Angles.Yaw + (((pr_fogspawn() % delta) - (delta >> 1)) * (360 / 256.));
		mo->target = self;
		if (self->args[0] < 1) self->args[0] = 1;
		mo->args[0] = (pr_fogspawn() % (self->args[0]))+1;	// Random speed
		mo->args[3] = self->args[3];						// Set lifetime
		mo->args[4] = 1;									// Set to moving
		mo->WeaveIndexZ = pr_fogspawn()&63;
	}
	return 0;
}